

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWriteVer.c
# Opt level: O3

void Wlc_WriteAddPos(Wlc_Ntk_t *p)

{
  uint uVar1;
  Wlc_Obj_t *pWVar2;
  Wlc_Obj_t *pWVar3;
  int iVar4;
  int *piVar5;
  ushort uVar6;
  long lVar7;
  long lVar8;
  
  (p->vPos).nSize = 0;
  iVar4 = p->iObj;
  if (1 < iVar4) {
    lVar7 = 1;
    lVar8 = 0x18;
    do {
      if (p->nObjsAlloc <= lVar7) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      pWVar2 = p->pObjs;
      uVar6 = *(ushort *)(&pWVar2->field_0x0 + lVar8) & 0x3f;
      if ((uVar6 != 1) && (uVar6 != 8)) {
        *(ushort *)(&pWVar2->field_0x0 + lVar8) = *(ushort *)(&pWVar2->field_0x0 + lVar8) | 0x200;
        pWVar3 = p->pObjs;
        uVar1 = (p->vPos).nSize;
        if (uVar1 == (p->vPos).nCap) {
          if ((int)uVar1 < 0x10) {
            piVar5 = (p->vPos).pArray;
            if (piVar5 == (int *)0x0) {
              piVar5 = (int *)malloc(0x40);
            }
            else {
              piVar5 = (int *)realloc(piVar5,0x40);
            }
            (p->vPos).pArray = piVar5;
            if (piVar5 == (int *)0x0) {
LAB_00359e66:
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            (p->vPos).nCap = 0x10;
          }
          else {
            piVar5 = (p->vPos).pArray;
            if (piVar5 == (int *)0x0) {
              piVar5 = (int *)malloc((ulong)uVar1 * 8);
            }
            else {
              piVar5 = (int *)realloc(piVar5,(ulong)uVar1 * 8);
            }
            (p->vPos).pArray = piVar5;
            if (piVar5 == (int *)0x0) goto LAB_00359e66;
            (p->vPos).nCap = uVar1 * 2;
          }
        }
        else {
          piVar5 = (p->vPos).pArray;
        }
        iVar4 = (p->vPos).nSize;
        (p->vPos).nSize = iVar4 + 1;
        piVar5[iVar4] = (int)((ulong)((long)pWVar2 + (lVar8 - (long)pWVar3)) >> 3) * -0x55555555;
        iVar4 = p->iObj;
      }
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0x18;
    } while (lVar7 < iVar4);
  }
  return;
}

Assistant:

void Wlc_WriteAddPos( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj;
    int i;
    Vec_IntClear( &p->vPos );
    Wlc_NtkForEachObj( p, pObj, i )
        if ( pObj->Type != WLC_OBJ_PI && pObj->Type != WLC_OBJ_MUX )
        {
            pObj->fIsPo = 1;
            Vec_IntPush( &p->vPos, Wlc_ObjId(p, pObj) );
        }
}